

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

void setup_expansion(dw_rom *rom)

{
  uint64_t uVar1;
  int track;
  dw_rom *rom_local;
  
  rom->header[4] = '\b';
  add_hook(rom,JSR,0x31eb,INC_BONK_CTR);
  add_hook(rom,JMP,0xccf0,START_DWR_CREDITS);
  add_hook(rom,JSR,0xdbb2,COUNT_SPELL_USE);
  add_hook(rom,JSR,0xccb8,SNAPSHOT_TIMER);
  add_hook(rom,JSR,0xe4ed,COUNT_ENCOUNTER);
  add_hook(rom,DIALOGUE,0xe5c7,PLAYER_AMBUSHED);
  add_hook(rom,JSR,0xe605,INC_ATTACK_CTR);
  add_hook(rom,JSR,0xe62a,INC_CRIT_CTR);
  add_hook(rom,JSR,0xe65a,INC_MISS_CTR);
  add_hook(rom,JSR,0xe68a,INC_DODGE_CTR);
  add_hook(rom,DIALOGUE,0xe89d,BLOCKED_IN_FRONT);
  add_hook(rom,JSR,0xe98c,COUNT_WIN);
  add_hook(rom,JSR,0xed9e,INC_ENEMY_DEATH_CTR);
  add_hook(rom,JSR,0xeda9,INC_DEATH_CTR);
  add_hook(rom,JSR,0xf720,INIT_SAVE_RAM);
  add_hook(rom,JSR,0xfee0,COUNT_FRAME);
  bank_3_patch(rom);
  fill_expansion(rom);
  uVar1 = mt_rand(0,0x12);
  add_music(rom,(int)uVar1);
  return;
}

Assistant:

void setup_expansion(dw_rom *rom)
{
    rom->header[4] = 8; /* set to 8 PRG banks */

    /* patching various routines to keep track of statistics */
    add_hook(rom, JSR, 0x31eb, INC_BONK_CTR);
    add_hook(rom, JMP, 0xccf0, START_DWR_CREDITS);
    add_hook(rom, JSR, 0xdbb2, COUNT_SPELL_USE);
    add_hook(rom, JSR, 0xccb8, SNAPSHOT_TIMER);
    add_hook(rom, JSR, 0xe4ed, COUNT_ENCOUNTER);
    add_hook(rom, DIALOGUE, 0xe5c7, PLAYER_AMBUSHED);
    add_hook(rom, JSR, 0xe605, INC_ATTACK_CTR);
    add_hook(rom, JSR, 0xe62a, INC_CRIT_CTR);
    add_hook(rom, JSR, 0xe65a, INC_MISS_CTR);
    add_hook(rom, JSR, 0xe68a, INC_DODGE_CTR);
    add_hook(rom, DIALOGUE, 0xe89d, BLOCKED_IN_FRONT);
    add_hook(rom, JSR, 0xe98c, COUNT_WIN);
    add_hook(rom, JSR, 0xed9e, INC_ENEMY_DEATH_CTR);
    add_hook(rom, JSR, 0xeda9, INC_DEATH_CTR);
    add_hook(rom, JSR, 0xf720, INIT_SAVE_RAM);
    add_hook(rom, JSR, 0xfee0, COUNT_FRAME);

    bank_3_patch(rom);
    fill_expansion(rom);

    int track = mt_rand(0, track_count - 1);
    add_music(rom, track);
}